

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O2

mp_size_t mpz_abs_add(__mpz_struct *r,__mpz_struct *a,__mpz_struct *b)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  mp_limb_t *rp;
  mp_limb_t mVar4;
  ulong bn;
  ulong an;
  __mpz_struct *p_Var5;
  
  uVar1 = a->_mp_size;
  uVar2 = -uVar1;
  if (0 < (int)uVar1) {
    uVar2 = uVar1;
  }
  uVar1 = b->_mp_size;
  uVar3 = -uVar1;
  if (0 < (int)uVar1) {
    uVar3 = uVar1;
  }
  bn = (ulong)uVar3;
  an = (ulong)uVar2;
  p_Var5 = b;
  if (uVar2 < uVar3) {
    an = bn;
    p_Var5 = a;
    a = b;
    bn = (ulong)uVar2;
  }
  if ((long)an < (long)r->_mp_alloc) {
    rp = r->_mp_d;
  }
  else {
    rp = mpz_realloc(r,an + 1);
  }
  mVar4 = mpn_add(rp,a->_mp_d,an,p_Var5->_mp_d,bn);
  rp[an] = mVar4;
  return mVar4 + an;
}

Assistant:

static mp_size_t
mpz_abs_add (mpz_t r, const mpz_t a, const mpz_t b)
{
  mp_size_t an = GMP_ABS (a->_mp_size);
  mp_size_t bn = GMP_ABS (b->_mp_size);
  mp_ptr rp;
  mp_limb_t cy;

  if (an < bn)
    {
      MPZ_SRCPTR_SWAP (a, b);
      MP_SIZE_T_SWAP (an, bn);
    }

  rp = MPZ_REALLOC (r, an + 1);
  cy = mpn_add (rp, a->_mp_d, an, b->_mp_d, bn);

  rp[an] = cy;

  return an + cy;
}